

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacCom.c
# Opt level: O3

int Bac_CommandPs(Abc_Frame_t *pAbc,int argc,char **argv)

{
  byte bVar1;
  undefined8 *puVar2;
  bool bVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  int iVar6;
  int iVar7;
  int iVar8;
  undefined4 extraout_var;
  size_t sVar9;
  long lVar10;
  undefined4 *puVar11;
  char *pcVar12;
  uint uVar13;
  long *plVar14;
  uint uVar15;
  ulong uVar16;
  Bac_Ntk_t *p;
  long lVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined8 local_40;
  
  puVar2 = (undefined8 *)pAbc->pAbcBac;
  local_40 = 0;
  Extra_UtilGetoptReset();
  bVar3 = false;
  do {
    while (iVar6 = Extra_UtilGetopt(argc,argv,"Mvh"), iVar7 = globalUtilOptind, iVar6 == 0x76) {
      bVar3 = (bool)(bVar3 ^ 1);
    }
    if (iVar6 == -1) {
      if (puVar2 == (undefined8 *)0x0) {
        Abc_Print(1,"Bac_CommandPs(): There is no current design.\n");
        return 0;
      }
      iVar7 = *(int *)(puVar2 + 4);
      uVar13 = 0;
      if (((long)iVar7 < 1) || (*(int *)((long)puVar2 + 0x24) < iVar7)) {
        lVar10 = 0;
      }
      else {
        lVar10 = (long)iVar7 * 0xd0 + puVar2[5];
      }
      printf("%-12s : ",*puVar2);
      printf("pi =%5d  ",(ulong)*(uint *)(lVar10 + 0x24));
      printf("po =%5d  ",(ulong)*(uint *)(lVar10 + 0x34));
      iVar7 = Abc_NamObjNumMax((Abc_Nam_t *)puVar2[3]);
      printf("pri =%4d  ",(ulong)(uint)(iVar7 - *(int *)((long)puVar2 + 0x24)));
      printf("mod =%6d  ",(ulong)*(uint *)((long)puVar2 + 0x24));
      if (0 < (int)*(uint *)((long)puVar2 + 0x24)) {
        uVar13 = 0;
        lVar10 = 1;
        do {
          iVar7 = *(int *)(puVar2[5] + 0x54 + lVar10 * 0xd0);
          iVar6 = 0;
          if (0 < (long)iVar7) {
            lVar17 = 0;
            iVar6 = 0;
            do {
              bVar1 = *(byte *)(*(long *)(lVar10 * 0xd0 + puVar2[5] + 0x58) + lVar17);
              if ((char)bVar1 < '\0') goto LAB_003b2e8f;
              iVar6 = iVar6 + (uint)(bVar1 < 10);
              lVar17 = lVar17 + 1;
            } while (iVar7 != lVar17);
          }
          uVar13 = (uVar13 + iVar7) - iVar6;
          lVar10 = lVar10 + 1;
        } while (lVar10 != (ulong)*(uint *)((long)puVar2 + 0x24) + 1);
      }
      uVar15 = 0;
      printf("box =%7d  ",(ulong)uVar13);
      if (0 < (int)*(uint *)((long)puVar2 + 0x24)) {
        lVar10 = 0;
        uVar15 = 0;
        do {
          uVar15 = uVar15 + *(int *)(puVar2[5] + 0x124 + lVar10);
          lVar10 = lVar10 + 0xd0;
        } while ((ulong)*(uint *)((long)puVar2 + 0x24) * 0xd0 - lVar10 != 0);
      }
      printf("obj =%7d  ",(ulong)uVar15);
      if ((char *)*puVar2 == (char *)0x0) {
        iVar7 = 0x530;
      }
      else {
        sVar9 = strlen((char *)*puVar2);
        iVar7 = (int)sVar9 + 0x530;
      }
      if ((char *)puVar2[1] != (char *)0x0) {
        sVar9 = strlen((char *)puVar2[1]);
        iVar7 = iVar7 + (int)sVar9;
      }
      iVar6 = Abc_NamMemUsed((Abc_Nam_t *)puVar2[2]);
      iVar8 = Abc_NamMemUsed((Abc_Nam_t *)puVar2[3]);
      iVar8 = iVar8 + iVar6 + iVar7;
      if (0 < (int)*(uint *)((long)puVar2 + 0x24)) {
        lVar10 = puVar2[5];
        lVar17 = 0;
        do {
          iVar7 = *(int *)(lVar10 + 0x120 + lVar17);
          auVar21._8_4_ = iVar7 >> 0x1f;
          auVar21._0_8_ = (long)iVar7;
          auVar21._12_4_ = 0x45300000;
          iVar8 = iVar8 + (int)(((double)((ulong)*(uint *)(lVar10 + 0x130 + lVar17) |
                                         0x4330000000000000) - 4503599627370496.0) * 4.0 + 16.0) +
                          (int)(((double)((ulong)*(uint *)(lVar10 + 0x170 + lVar17) |
                                         0x4330000000000000) - 4503599627370496.0) * 4.0 + 16.0) +
                          (int)(((double)((ulong)*(uint *)(lVar10 + 0x100 + lVar17) |
                                         0x4330000000000000) - 4503599627370496.0) * 4.0 + 16.0) +
                          (int)(((double)((ulong)*(uint *)(lVar10 + 0x150 + lVar17) |
                                         0x4330000000000000) - 4503599627370496.0) * 4.0 + 16.0) +
                          (int)(((double)((ulong)*(uint *)(lVar10 + 0x110 + lVar17) |
                                         0x4330000000000000) - 4503599627370496.0) * 4.0 + 16.0) +
                          (int)(((double)((ulong)*(uint *)(lVar10 + 0x160 + lVar17) |
                                         0x4330000000000000) - 4503599627370496.0) * 4.0 + 16.0) +
                          (int)(((double)((ulong)*(uint *)(lVar10 + 0xf0 + lVar17) |
                                         0x4330000000000000) - 4503599627370496.0) * 4.0 + 16.0) +
                          (int)(((double)((ulong)*(uint *)(lVar10 + 0x140 + lVar17) |
                                         0x4330000000000000) - 4503599627370496.0) * 4.0 + 16.0) +
                          (int)((auVar21._8_8_ - 1.9342813113834067e+25) +
                                ((double)CONCAT44(0x43300000,iVar7) - 4503599627370496.0) + 16.0) +
                  0xd0;
          lVar17 = lVar17 + 0xd0;
        } while ((ulong)*(uint *)((long)puVar2 + 0x24) * 0xd0 - lVar17 != 0);
      }
      printf("mem =%6.3f MB",(double)iVar8 * 9.5367431640625e-07);
      putchar(10);
      auVar5 = _DAT_0093e4e0;
      auVar4 = _DAT_0093d220;
      auVar21 = _DAT_0093d210;
      iVar7 = *(int *)((long)puVar2 + 0x24);
      if (0 < (long)iVar7) {
        lVar10 = (long)iVar7 + -1;
        auVar18._8_4_ = (int)lVar10;
        auVar18._0_8_ = lVar10;
        auVar18._12_4_ = (int)((ulong)lVar10 >> 0x20);
        puVar11 = (undefined4 *)(puVar2[5] + 0xe8);
        uVar16 = 0;
        auVar18 = auVar18 ^ _DAT_0093d220;
        do {
          auVar19._8_4_ = (int)uVar16;
          auVar19._0_8_ = uVar16;
          auVar19._12_4_ = (int)(uVar16 >> 0x20);
          auVar20 = (auVar19 | auVar21) ^ auVar4;
          iVar6 = auVar18._4_4_;
          if ((bool)(~(auVar20._4_4_ == iVar6 && auVar18._0_4_ < auVar20._0_4_ ||
                      iVar6 < auVar20._4_4_) & 1)) {
            *puVar11 = 0xffffffff;
          }
          if ((auVar20._12_4_ != auVar18._12_4_ || auVar20._8_4_ <= auVar18._8_4_) &&
              auVar20._12_4_ <= auVar18._12_4_) {
            puVar11[0x34] = 0xffffffff;
          }
          auVar19 = (auVar19 | auVar5) ^ auVar4;
          iVar8 = auVar19._4_4_;
          if (iVar8 <= iVar6 && (iVar8 != iVar6 || auVar19._0_4_ <= auVar18._0_4_)) {
            puVar11[0x68] = 0xffffffff;
            puVar11[0x9c] = 0xffffffff;
          }
          uVar16 = uVar16 + 4;
          puVar11 = puVar11 + 0xd0;
        } while ((iVar7 + 3U & 0xfffffffc) != uVar16);
      }
      uVar13 = *(uint *)(puVar2 + 4);
      if (iVar7 < (int)uVar13 || (int)uVar13 < 1) {
        p = (Bac_Ntk_t *)0x0;
      }
      else {
        p = (Bac_Ntk_t *)((ulong)uVar13 * 0xd0 + puVar2[5]);
      }
      Bac_ManBoxNum_rec(p);
      if (*(int *)((long)puVar2 + 0x24) < 1) {
        return 0;
      }
      uVar16 = 1;
      do {
        if (uVar16 == (int)local_40 + 1) {
          return 0;
        }
        plVar14 = (long *)(uVar16 * 0xd0 + puVar2[5]);
        iVar6 = 0;
        printf("Module %5d : ",uVar16 & 0xffffffff);
        printf("pi =%5d  ",(ulong)*(uint *)((long)plVar14 + 0x24));
        printf("pi =%5d  ",(ulong)*(uint *)((long)plVar14 + 0x34));
        iVar7 = *(int *)((long)plVar14 + 0x54);
        if (0 < (long)iVar7) {
          lVar10 = 0;
          iVar6 = 0;
          do {
            if ((char)*(byte *)(plVar14[0xb] + lVar10) < '\0') {
LAB_003b2e8f:
              __assert_fail("Lit >= 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                            ,0x12f,"int Abc_Lit2Var(int)");
            }
            iVar6 = iVar6 + (uint)(*(byte *)(plVar14[0xb] + lVar10) < 10);
            lVar10 = lVar10 + 1;
          } while (iVar7 != lVar10);
        }
        printf("box =%6d  ",(ulong)(uint)(iVar7 - iVar6));
        printf("clp =%7d  ",(ulong)*(uint *)(plVar14 + 3));
        printf("obj =%7d  ",(ulong)*(uint *)((long)plVar14 + 0x54));
        pcVar12 = Abc_NamStr(*(Abc_Nam_t **)(*plVar14 + 0x10),(int)plVar14[1]);
        printf("%s ",pcVar12);
        iVar7 = (int)plVar14[2];
        if ((0 < (long)iVar7) && (iVar7 <= *(int *)(*plVar14 + 0x24))) {
          lVar10 = *(long *)(*plVar14 + 0x28);
          lVar17 = (long)iVar7 * 0xd0;
          pcVar12 = Abc_NamStr(*(Abc_Nam_t **)(*(long *)(lVar10 + lVar17) + 0x10),
                               *(int *)(lVar10 + 8 + lVar17));
          printf("-> %s",pcVar12);
        }
        putchar(10);
        bVar3 = (long)*(int *)((long)puVar2 + 0x24) <= (long)uVar16;
        uVar16 = uVar16 + 1;
        if (bVar3) {
          return 0;
        }
      } while( true );
    }
    if (iVar6 != 0x4d) goto LAB_003b2dfe;
    if (argc <= globalUtilOptind) {
      Abc_Print(-1,"Command line switch \"-M\" should be followed by an integer.\n");
      goto LAB_003b2dfe;
    }
    iVar6 = atoi(argv[globalUtilOptind]);
    local_40 = CONCAT44(extraout_var,iVar6);
    globalUtilOptind = iVar7 + 1;
    if (iVar6 < 0) {
LAB_003b2dfe:
      Abc_Print(-2,"usage: @_ps [-M num] [-vh]\n");
      Abc_Print(-2,"\t         prints statistics\n");
      Abc_Print(-2,"\t-M num : the number of first modules to report [default = %d]\n",local_40);
      pcVar12 = "yes";
      if (!bVar3) {
        pcVar12 = "no";
      }
      Abc_Print(-2,"\t-v     : toggle printing verbose information [default = %s]\n",pcVar12);
      Abc_Print(-2,"\t-h     : print the command usage\n");
      return 1;
    }
  } while( true );
}

Assistant:

int Bac_CommandPs( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Bac_Man_t * p = Bac_AbcGetMan(pAbc);
    int c, nModules = 0, fVerbose  = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "Mvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'M':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-M\" should be followed by an integer.\n" );
                goto usage;
            }
            nModules = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nModules < 0 )
                goto usage;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( p == NULL )
    {
        Abc_Print( 1, "Bac_CommandPs(): There is no current design.\n" );
        return 0;
    }
    Bac_ManPrintStats( p, nModules, fVerbose );
    return 0;
usage:
    Abc_Print( -2, "usage: @_ps [-M num] [-vh]\n" );
    Abc_Print( -2, "\t         prints statistics\n" );
    Abc_Print( -2, "\t-M num : the number of first modules to report [default = %d]\n", nModules );
    Abc_Print( -2, "\t-v     : toggle printing verbose information [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}